

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_tools.cpp
# Opt level: O2

ON_Mesh * ON_ControlPolygonMesh(ON_NurbsSurface *nurbs_surface,bool bCleanMesh,ON_Mesh *input_mesh)

{
  undefined8 *puVar1;
  ON_3dPoint *v;
  ON_3dPoint *v_00;
  undefined8 uVar2;
  float fVar3;
  ON_Mesh *this;
  char cVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  ON_Mesh *pOVar10;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_3dPoint *pOVar11;
  ON_3fVector *pOVar12;
  ON_2dPoint *pOVar13;
  ON_2fPoint *this_01;
  ON_MeshFace *pOVar14;
  int vertex_index;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  undefined7 in_register_00000031;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  size_t newcap;
  ulong uVar23;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  uint local_1e8;
  char local_1e4;
  char local_1e3;
  char local_1e2;
  char local_1e1;
  double local_1e0;
  ulong local_1d8;
  double local_1d0;
  ON_NurbsSurface *local_1c8;
  ON_Mesh *local_1c0;
  ulong local_1b8;
  uint local_1ac;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  undefined4 local_18c;
  ON_SimpleArray<double> gv;
  ON_SimpleArray<double> gu;
  ON_3dPoint local_148;
  ON_Interval d1;
  ON_Interval d0;
  ON_SimpleArray<int> badfi;
  ON_3dPoint V;
  int hint [2];
  ON_2dPoint T;
  ON_3dPoint P [4];
  ON_3dVector N;
  
  uVar6 = ON_NurbsSurface::CVCount(nurbs_surface,0);
  uVar23 = (ulong)uVar6;
  uVar7 = ON_NurbsSurface::CVCount(nurbs_surface,1);
  if (nurbs_surface->m_cv != (double *)0x0) {
    iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6]
            )(nurbs_surface,0);
    if ((char)iVar8 != '\0') {
      ON_SimpleArray<double>::ON_SimpleArray(&gu,(long)(int)uVar6);
      ON_SimpleArray<double>::ON_SimpleArray(&gv,(long)(int)uVar7);
      if ((-1 < (int)uVar6) && ((int)uVar6 <= gu.m_capacity)) {
        gu.m_count = uVar6;
      }
      if ((-1 < (int)uVar7) && ((int)uVar7 <= gv.m_capacity)) {
        gv.m_count = uVar7;
      }
      ON_NurbsSurface::GetGrevilleAbcissae(nurbs_surface,0,gu.m_a);
      ON_NurbsSurface::GetGrevilleAbcissae(nurbs_surface,1,gv.m_a);
      (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (nurbs_surface,0);
      d0.m_t[0] = extraout_XMM0_Qa;
      d0.m_t[1] = in_XMM1_Qa;
      (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (nurbs_surface,1);
      d1.m_t[0] = extraout_XMM0_Qa_00;
      d1.m_t[1] = in_XMM1_Qa;
      iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x31])(nurbs_surface,0);
      local_1e3 = '\x01';
      cVar4 = (char)iVar8;
      if (cVar4 == '\0') {
        iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x30])(nurbs_surface,0);
        local_1e3 = (char)iVar8;
      }
      local_18c = (undefined4)CONCAT71(in_register_00000031,bCleanMesh);
      local_1d0 = (double)(ulong)uVar7;
      iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x31])(nurbs_surface);
      local_1e1 = (char)iVar8;
      local_1e4 = '\x01';
      local_1e2 = cVar4;
      if (local_1e1 == '\0') {
        iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x30])(nurbs_surface);
        local_1e4 = (char)iVar8;
      }
      uVar20 = 0;
      uVar18 = 0;
      local_1c8 = nurbs_surface;
      if (local_1e2 != '\0') {
        iVar8 = (*(nurbs_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object.
                  _vptr_ON_Object[0x2b])(nurbs_surface);
        uVar6 = (uVar6 - iVar8) + 1;
        local_198 = (ulong)uVar6;
        lVar21 = (long)(int)uVar6;
        lVar22 = lVar21 << 0x20;
        local_1b8 = lVar21 * 8 + -8;
        for (uVar18 = 0; iVar8 = ON_NurbsSurface::CVCount(local_1c8,0),
            (long)(uVar18 + lVar21) < (long)iVar8; uVar18 = uVar18 + 1) {
          local_1e0 = gu.m_a[uVar18];
          pdVar9 = ON_Interval::operator[](&d0,0);
          if (*pdVar9 <= local_1e0) break;
          local_1e0 = *(double *)((long)gu.m_a + uVar18 * 8 + local_1b8);
          pdVar9 = ON_Interval::operator[](&d0,1);
          if (*pdVar9 < local_1e0) break;
          lVar22 = lVar22 + 0x100000000;
        }
        ON_Interval::Set(&d0,gu.m_a[uVar18],*(double *)((long)gu.m_a + (lVar22 >> 0x1d) + -8));
        uVar23 = (local_198 & 0xffffffff) + uVar18;
      }
      local_1b8 = uVar18;
      local_198 = uVar23;
      if (local_1e1 != '\0') {
        iVar8 = (*(local_1c8->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x2b])(local_1c8,1);
        uVar6 = (SUB84(local_1d0,0) - iVar8) + 1;
        local_1d0 = (double)(ulong)uVar6;
        lVar21 = (long)(int)uVar6;
        lVar22 = lVar21 << 0x20;
        for (uVar20 = 0; iVar8 = ON_NurbsSurface::CVCount(local_1c8,1),
            (long)(uVar20 + lVar21) < (long)iVar8; uVar20 = uVar20 + 1) {
          local_1e0 = gv.m_a[uVar20];
          pdVar9 = ON_Interval::operator[](&d1,0);
          if (*pdVar9 <= local_1e0) break;
          local_1e0 = gv.m_a[lVar21 + (uVar20 - 1)];
          pdVar9 = ON_Interval::operator[](&d1,1);
          if (*pdVar9 < local_1e0) break;
          lVar22 = lVar22 + 0x100000000;
        }
        ON_Interval::Set(&d1,gv.m_a[uVar20],*(double *)((long)gv.m_a + (lVar22 >> 0x1d) + -8));
        local_1d0 = (double)(((ulong)local_1d0 & 0xffffffff) + uVar20);
      }
      pOVar10 = input_mesh;
      if (input_mesh == (ON_Mesh *)0x0) {
        pOVar10 = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh::ON_Mesh(pOVar10);
      }
      this_00 = &ON_Mesh::DoublePrecisionVertices(pOVar10)->super_ON_SimpleArray<ON_3dPoint>;
      uVar6 = (int)local_198 - (int)local_1b8;
      local_1d8 = (ulong)uVar6;
      local_1ac = SUB84(local_1d0,0) - (int)uVar20;
      local_1a8 = (ulong)local_1ac;
      local_1ac = local_1ac * uVar6;
      newcap = (size_t)(int)local_1ac;
      ON_SimpleArray<ON_3dPoint>::Reserve(this_00,newcap);
      ON_SimpleArray<ON_3fVector>::Reserve(&(pOVar10->m_N).super_ON_SimpleArray<ON_3fVector>,newcap)
      ;
      ON_SimpleArray<ON_2fPoint>::Reserve(&(pOVar10->m_T).super_ON_SimpleArray<ON_2fPoint>,newcap);
      ON_SimpleArray<ON_2dPoint>::Reserve(&(pOVar10->m_S).super_ON_SimpleArray<ON_2dPoint>,newcap);
      uVar7 = (int)local_1d8 - 1;
      uVar6 = (int)local_1a8 - 1;
      local_1a0 = (ulong)uVar6;
      ON_SimpleArray<ON_MeshFace>::Reserve(&pOVar10->m_F,(long)(int)(uVar6 * uVar7));
      *(double *)&pOVar10->field_0x240 = d0.m_t[0];
      *(double *)&pOVar10->field_0x248 = d0.m_t[1];
      *(double *)&pOVar10->field_0x250 = d1.m_t[0];
      *(double *)&pOVar10->field_0x258 = d1.m_t[1];
      hint[0] = 0;
      hint[1] = 0;
      lVar21 = (long)local_1d0._0_4_;
      iVar8 = -1;
      local_1c0 = pOVar10;
      for (uVar23 = uVar20 & 0xffffffff; this = local_1c0, (long)uVar23 < lVar21;
          uVar23 = uVar23 + 1) {
        local_1d0 = gv.m_a[uVar23];
        T.y = ON_Interval::NormalizedParameterAt(&d1,local_1d0);
        uVar18 = local_1b8 & 0xffffffff;
        while( true ) {
          local_1e8 = (uint)uVar18;
          if ((int)local_198 <= (int)local_1e8) break;
          ON_NurbsSurface::GetCV(local_1c8,local_1e8,(int)uVar23,&V);
          local_1e0 = gu.m_a[(int)local_1e8];
          T.x = ON_Interval::NormalizedParameterAt(&d0,local_1e0);
          ON_Surface::EvNormal
                    (&local_1c8->super_ON_Surface,gu.m_a[(int)local_1e8],gv.m_a[uVar23],&N,0,hint);
          pOVar11 = ON_SimpleArray<ON_3dPoint>::AppendNew(this_00);
          pOVar11->z = V.z;
          pOVar11->x = V.x;
          pOVar11->y = V.y;
          pOVar12 = ON_SimpleArray<ON_3fVector>::AppendNew
                              (&(pOVar10->m_N).super_ON_SimpleArray<ON_3fVector>);
          ON_3fVector::operator=(pOVar12,&N);
          pOVar13 = ON_SimpleArray<ON_2dPoint>::AppendNew
                              (&(pOVar10->m_S).super_ON_SimpleArray<ON_2dPoint>);
          pOVar13->x = local_1e0;
          pOVar13->y = local_1d0;
          this_01 = ON_SimpleArray<ON_2fPoint>::AppendNew
                              (&(pOVar10->m_T).super_ON_SimpleArray<ON_2fPoint>);
          ON_2fPoint::operator=(this_01,&T);
          if (((int)local_1b8 < (int)local_1e8) && ((uVar20 & 0xffffffff) < uVar23)) {
            pOVar14 = ON_SimpleArray<ON_MeshFace>::AppendNew(&pOVar10->m_F);
            pOVar14->vi[0] = iVar8;
            iVar8 = iVar8 + 1;
            pOVar14->vi[1] = iVar8;
            *(ulong *)(pOVar14->vi + 2) = CONCAT44(this_00->m_count + -2,this_00->m_count + -1);
          }
          uVar18 = (ulong)(local_1e8 + 1);
        }
        iVar8 = iVar8 + 1;
      }
      ON_Mesh::UpdateSinglePrecisionVertices(local_1c0);
      cVar4 = local_1e2;
      if (local_1e3 != '\0') {
        local_1e8 = 0;
        uVar20 = 0;
        uVar18 = local_1a8 & 0xffffffff;
        if ((int)local_1a8 < 1) {
          uVar18 = uVar20;
        }
        local_1a8 = uVar18;
        while (iVar8 = (int)uVar18, uVar18 = (ulong)(iVar8 - 1), uVar23 = local_1a8, iVar8 != 0) {
          iVar8 = (int)uVar20;
          ON_Mesh::Vertex(P,this,iVar8);
          iVar16 = uVar7 + iVar8;
          ON_Mesh::SetVertex(this,iVar16,P);
          if (cVar4 != '\0') {
            pOVar12 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
            pOVar12[iVar16].z = pOVar12[(int)local_1e8].z;
            fVar3 = pOVar12[(int)local_1e8].y;
            pOVar12[iVar16].x = pOVar12[(int)local_1e8].x;
            pOVar12[iVar16].y = fVar3;
          }
          local_1e8 = iVar8 + (int)local_1d8;
          uVar20 = (ulong)local_1e8;
        }
      }
      iVar8 = (int)local_1d8;
      iVar16 = (int)local_1a0;
      if (local_1e4 != '\0') {
        vertex_index = iVar16 * (int)local_1d8;
        lVar21 = (long)vertex_index * 0xc;
        for (local_1e8 = 0; (int)local_1e8 < (int)local_1d8; local_1e8 = local_1e8 + 1) {
          ON_Mesh::Vertex(P,this,local_1e8);
          ON_Mesh::SetVertex(this,vertex_index,P);
          if (local_1e1 != '\0') {
            pOVar12 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
            *(float *)((long)&pOVar12->z + lVar21) = pOVar12[(int)local_1e8].z;
            *(undefined8 *)((long)&pOVar12->x + lVar21) = *(undefined8 *)(pOVar12 + (int)local_1e8);
          }
          lVar21 = lVar21 + 0xc;
          vertex_index = vertex_index + 1;
        }
      }
      uVar6 = iVar16 * iVar8;
      local_1a0 = (ulong)uVar6;
      local_1e8 = 0;
      for (uVar17 = 0; (int)uVar17 < 4; uVar17 = uVar17 + 1) {
        iVar8 = (*(local_1c8->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x32])(local_1c8,(ulong)uVar17);
        if ((char)iVar8 != '\0') {
          switch(uVar17) {
          case 0:
            local_1e8 = 0;
            uVar23 = 1;
            uVar17 = (uint)local_1d8;
            break;
          case 1:
            uVar23 = local_1d8;
            uVar17 = local_1ac;
            local_1e8 = uVar7;
            break;
          case 2:
            uVar23 = 1;
            uVar17 = local_1ac;
            local_1e8 = (uint)local_1a0;
            break;
          case 3:
            local_1e8 = 0;
            uVar23 = local_1d8;
            uVar17 = uVar6 + 1;
          }
          ON_Mesh::Vertex(P,local_1c0,local_1e8);
          V.z = P[0].z;
          V.x = P[0].x;
          V.y = P[0].y;
          while (local_1e8 = local_1e8 + (int)uVar23, (int)local_1e8 < (int)uVar17) {
            ON_Mesh::SetVertex(local_1c0,local_1e8,&V);
          }
        }
      }
      pOVar10 = local_1c0;
      if ((char)local_18c != '\0') {
        ON_SimpleArray<int>::ON_SimpleArray(&badfi,0x20);
        pOVar10 = local_1c0;
        pOVar11 = P + 1;
        v = P + 3;
        uVar6 = 0;
        while (iVar8 = (pOVar10->m_F).m_count, local_1e8 = uVar6, (int)uVar6 < iVar8) {
          pOVar14 = (pOVar10->m_F).m_a;
          ON_Mesh::Vertex(&local_148,pOVar10,pOVar14[(int)uVar6].vi[0]);
          pOVar14 = pOVar14 + (int)uVar6;
          P[0].z = local_148.z;
          P[0].x = local_148.x;
          P[0].y = local_148.y;
          ON_Mesh::Vertex(&local_148,pOVar10,pOVar14->vi[1]);
          P[1].z = local_148.z;
          P[1].x = local_148.x;
          P[1].y = local_148.y;
          ON_Mesh::Vertex(&local_148,pOVar10,pOVar14->vi[2]);
          P[2].z = local_148.z;
          P[2].x = local_148.x;
          P[2].y = local_148.y;
          ON_Mesh::Vertex(&local_148,pOVar10,pOVar14->vi[3]);
          P[3].z = local_148.z;
          P[3].x = local_148.x;
          P[3].y = local_148.y;
          bVar5 = ON_3dPoint::operator==(P,pOVar11);
          v_00 = P + 2;
          if (bVar5) {
            *(undefined8 *)(pOVar14->vi + 1) = *(undefined8 *)(pOVar14->vi + 2);
            P[1].z = P[2].z;
            P[1].x = P[2].x;
            P[1].y = P[2].y;
            P[2].x = P[3].x;
            P[2].y = P[3].y;
            P[2].z = P[3].z;
          }
          bVar5 = ON_3dPoint::operator==(pOVar11,v_00);
          if (bVar5) {
            pOVar14->vi[2] = pOVar14->vi[3];
            P[2].z = P[3].z;
            P[2].x = P[3].x;
            P[2].y = P[3].y;
          }
          bVar5 = ON_3dPoint::operator==(v_00,v);
          if (bVar5) {
            pOVar14->vi[2] = pOVar14->vi[3];
            P[2].z = P[3].z;
            P[2].x = P[3].x;
            P[2].y = P[3].y;
          }
          bVar5 = ON_3dPoint::operator==(v,P);
          if (bVar5) {
            *(undefined8 *)pOVar14->vi = *(undefined8 *)(pOVar14->vi + 1);
            pOVar14->vi[2] = pOVar14->vi[3];
            P[0].z = P[1].z;
            P[0].x = P[1].x;
            P[0].y = P[1].y;
            P[1].z = P[2].z;
            P[1].x = P[2].x;
            P[1].y = P[2].y;
            P[2].z = P[3].z;
            P[2].x = P[3].x;
            P[2].y = P[3].y;
          }
          if ((((pOVar14->vi[0] == pOVar14->vi[1]) || (pOVar14->vi[1] == pOVar14->vi[2])) ||
              (pOVar14->vi[3] == pOVar14->vi[0])) ||
             ((bVar5 = ON_3dPoint::operator==(P,v_00), bVar5 ||
              (bVar5 = ON_3dPoint::operator==(pOVar11,v), bVar5)))) {
            ON_SimpleArray<int>::Append(&badfi,(int *)&local_1e8);
          }
          uVar6 = local_1e8 + 1;
        }
        if (0 < badfi.m_count) {
          if (badfi.m_count != iVar8) {
            local_1e8 = *badfi.m_a;
            lVar22 = (long)(int)local_1e8;
            lVar21 = 1;
            do {
              lVar15 = lVar22 << 4;
              lVar21 = (long)(int)lVar21;
              while( true ) {
                lVar22 = lVar22 + 1;
                if (iVar8 <= lVar22) {
                  if ((-1 < (int)local_1e8) && ((int)local_1e8 <= (pOVar10->m_F).m_capacity)) {
                    (pOVar10->m_F).m_count = local_1e8;
                  }
                  ON_Mesh::CullUnusedVertices(pOVar10);
                  goto LAB_005417df;
                }
                if ((badfi.m_count <= (int)lVar21) || ((int)lVar22 != badfi.m_a[lVar21])) break;
                lVar15 = lVar15 + 0x10;
                lVar21 = lVar21 + 1;
              }
              pOVar14 = (pOVar10->m_F).m_a;
              lVar19 = (long)(int)local_1e8;
              local_1e8 = local_1e8 + 1;
              puVar1 = (undefined8 *)((long)pOVar14[1].vi + lVar15);
              uVar2 = puVar1[1];
              pOVar14 = pOVar14 + lVar19;
              *(undefined8 *)pOVar14->vi = *puVar1;
              *(undefined8 *)(pOVar14->vi + 2) = uVar2;
              iVar8 = (pOVar10->m_F).m_count;
            } while( true );
          }
          if (input_mesh == (ON_Mesh *)0x0) {
            (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar10);
          }
          else {
            ON_Mesh::Destroy(pOVar10);
          }
          pOVar10 = (ON_Mesh *)0x0;
        }
LAB_005417df:
        ON_SimpleArray<int>::~ON_SimpleArray(&badfi);
      }
      ON_SimpleArray<double>::~ON_SimpleArray(&gv);
      ON_SimpleArray<double>::~ON_SimpleArray(&gu);
      return pOVar10;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_tools.cpp"
             ,0x355,"","ON_ControlPolygonMesh - surface is not valid");
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_ControlPolygonMesh(
  const ON_NurbsSurface& nurbs_surface,
  bool bCleanMesh,
  ON_Mesh* input_mesh
)
{
  int u0 = 0;
  int u1 = nurbs_surface.CVCount(0);

  int v0 = 0;
  int v1 = nurbs_surface.CVCount(1);

  if ( 0 == nurbs_surface.m_cv || !nurbs_surface.IsValid() )
  {
    ON_ERROR("ON_ControlPolygonMesh - surface is not valid");
    return nullptr;
  }

  ON_SimpleArray<double> gu(u1);
  ON_SimpleArray<double> gv(v1);
  gu.SetCount(u1);
  gv.SetCount(v1);
  nurbs_surface.GetGrevilleAbcissae(0,gu.Array());
  nurbs_surface.GetGrevilleAbcissae(1,gv.Array());

  ON_Interval d0 = nurbs_surface.Domain(0);
  ON_Interval d1 = nurbs_surface.Domain(1);

  bool bPeriodic0 = nurbs_surface.IsPeriodic(0)?true:false;
  bool bIsClosed0 = bPeriodic0 ? true : (nurbs_surface.IsClosed(0)?true:false);
  bool bPeriodic1 = nurbs_surface.IsPeriodic(1)?true:false;
  bool bIsClosed1 = bPeriodic1 ? true : (nurbs_surface.IsClosed(1)?true:false);

  if ( bPeriodic0 )
  {
    u1 -= (nurbs_surface.Degree(0) - 1);
    while ( u1 < nurbs_surface.CVCount(0) && gu[u0] < d0[0] && gu[u1-1] <= d0[1] )
    {
      u0++;
      u1++;
    }
    d0.Set(gu[u0],gu[u1-1]);
  }

  if ( bPeriodic1 )
  {
    v1 -= (nurbs_surface.Degree(1) - 1);
    while ( v1 < nurbs_surface.CVCount(1) && gv[v0] < d1[0] && gv[v1-1] <= d1[1] )
    {
      v0++;
      v1++;
    }
    d1.Set(gv[v0],gv[v1-1]);
  }


  ON_Mesh* mesh = (0 == input_mesh) ? new ON_Mesh() : input_mesh;

  int vertex_count = (u1-u0)*(v1-v0);
  int face_count = (u1-u0-1)*(v1-v0-1);

  ON_3dPointArray& dpv = mesh->DoublePrecisionVertices();
  dpv.Reserve(vertex_count);
  mesh->m_N.Reserve(vertex_count);
  mesh->m_T.Reserve(vertex_count);
  mesh->m_S.Reserve(vertex_count);
  mesh->m_F.Reserve(face_count);
  mesh->m_srf_domain[0] = d0;
  mesh->m_srf_domain[1] = d1;

  ON_3dPoint V;
  ON_3dVector N;
  ON_2dPoint S;
  ON_2dPoint T;

  int hint[2] = {0,0};
  int i, j;
  int k = -1;
  for ( j = v0; j < v1; j++)
  {
    S.y = gv[j];
    T.y = d1.NormalizedParameterAt(S.y);
    for ( i = u0; i < u1; i++)
    {
      nurbs_surface.GetCV( i, j, V);
      S.x = gu[i];
      T.x = d0.NormalizedParameterAt(S.x);
      nurbs_surface.EvNormal(gu[i],gv[j],N,0,hint);
      dpv.AppendNew() = V;
      mesh->m_N.AppendNew() = N;
      mesh->m_S.AppendNew() = S;
      mesh->m_T.AppendNew() = T;
      if ( i > u0 && j > v0 )
      {
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = k++;
        f.vi[1] = k;
        f.vi[2] = dpv.Count()-1;
        f.vi[3] = f.vi[2]-1;
      }
    }
    k++;
  }
  
  mesh->UpdateSinglePrecisionVertices();

  u1 -= u0;
  v1 -= v0;

  // make sure closed seams are spot on
  if ( bIsClosed0 )
  {
    i = 0;
    for ( j = 0; j < v1; j++ )
    {
      k = i + (u1-1);
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic0 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      i = k+1;
      // do NOT synch texture coordinates
    }
  }

  if ( bIsClosed1 )
  {
    for ( i = 0, k = u1*(v1-1); i < u1; i++, k++ )
    {
      mesh->SetVertex(k, mesh->Vertex(i));
      if ( bPeriodic1 )
      {
        mesh->m_N[k] = mesh->m_N[i];
      }
      // do NOT synch texture coordinates
    }
  }

  // make sure singular ends are spot on
  i=0;
  for ( k = 0; k < 4; k++ )
  {
    if ( nurbs_surface.IsSingular(k) )
    {
      switch(k)
      {
      case 0: // 0 = south
        i = 0;
        j = 1;
        k = u1;
        break;

      case 1: // 1 = east
        i = u1-1;
        j = u1;
        k = u1*v1;
        break;

      case 2: // 2 = north
        i = u1*(v1-1);
        j = 1;
        k = u1*v1;
        break;

      case 3: // 3 = west
        i = 0;
        j = u1;
        k = u1*(v1-1)+1;
        break;
      }
      V = mesh->Vertex(i);
      for ( i = i+j; i < k; i += j )
      {
        mesh->SetVertex(i, V);
      }
    }
  }

  if ( bCleanMesh )
  {
    // Clean up triangles etc.
    ON_3dPoint P[4];
    ON_SimpleArray<int> badfi(32);
    for ( i = 0; i < mesh->m_F.Count(); i++ )
    {
      ON_MeshFace& f = mesh->m_F[i];
      P[0] = mesh->Vertex(f.vi[0]);
      P[1] = mesh->Vertex(f.vi[1]);
      P[2] = mesh->Vertex(f.vi[2]);
      P[3] = mesh->Vertex(f.vi[3]);
      if ( P[0] == P[1] )
      {
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[1] = P[2];
        P[2] = P[3];
      }
      if ( P[1] == P[2] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[2] == P[3] )
      {
        f.vi[2] = f.vi[3];
        P[2] = P[3];
      }
      if ( P[3] == P[0] )
      {
        f.vi[0] = f.vi[1];
        f.vi[1] = f.vi[2];
        f.vi[2] = f.vi[3];
        P[0] = P[1];
        P[1] = P[2];
        P[2] = P[3];
      }
      if (    f.vi[0] == f.vi[1] 
           || f.vi[1] == f.vi[2] 
           || f.vi[3] == f.vi[0] 
           || P[0] == P[2] || P[1] == P[3] )
      {
        badfi.Append(i);
      }
    }
    
    if ( badfi.Count() > 0 )
    {
      if ( badfi.Count() == mesh->m_F.Count() )
      {
        if ( input_mesh )
        {
          mesh->Destroy();
        }
        else
        {
          delete mesh;
        }
        mesh = 0;
      }
      else
      {
        // remove bad faces
        i = badfi[0];
        j = i+1;
        k = 1;
        for ( j = i+1; j < mesh->m_F.Count(); j++ )
        {
          if ( k < badfi.Count() && j == badfi[k] )
          {
            k++;
          }
          else
          {
            mesh->m_F[i++] = mesh->m_F[j];
          }
        }
        mesh->m_F.SetCount(i);
      }

      // 29 May 2008: Mikko, TRR 34687:
      // Added crash protection. At this point mesh is nullptr if it contained all bad faces.
      if ( mesh)
        mesh->CullUnusedVertices();
    }
  }

  return mesh;
}